

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O1

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  size_t _elemsize;
  size_t sVar2;
  size_t sVar3;
  _func_int **pp_Var4;
  int *piVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  float fVar24;
  allocator_type local_169;
  Mat local_168;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  Mat local_f8;
  long local_b0;
  void *local_a8;
  long local_a0;
  void *local_98;
  long local_90;
  void *local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar9 = bottom_top_blob->w;
  local_118 = (ulong)(uint)bottom_top_blob->h;
  _c = bottom_top_blob->c;
  uVar12 = (ulong)_c;
  _elemsize = bottom_top_blob->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,uVar9,bottom_top_blob->h,_c,_elemsize,opt->workspace_allocator);
  iVar23 = -100;
  if ((local_f8.data == (void *)0x0) || ((long)local_f8.c * local_f8.cstep == 0)) goto LAB_00348b47;
  iVar8 = (int)local_118 * uVar9;
  if (0 < (int)_c) {
    pvVar10 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar20 = 0;
    pvVar16 = local_f8.data;
    do {
      if (0 < iVar8) {
        lVar22 = 0;
        do {
          fVar1 = *(float *)((long)pvVar10 + lVar22 * 4);
          *(float *)((long)pvVar16 + lVar22 * 4) = fVar1 * fVar1;
          lVar22 = lVar22 + 1;
        } while (iVar8 != (int)lVar22);
      }
      uVar20 = uVar20 + 1;
      pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
      pvVar16 = (void *)((long)pvVar16 +
                        local_f8.cstep *
                        CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
    } while (uVar20 != uVar12);
  }
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86[-3]) == 0) {
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,uVar9,(int)local_118,_c,_elemsize,opt->workspace_allocator);
    bVar7 = local_168.data == (void *)0x0 || (long)local_168.c * local_168.cstep == 0;
    if (bVar7) {
      piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
joined_r0x00348ad6:
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_00348b25:
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      goto LAB_00348b47;
    }
    local_118 = CONCAT71(local_118._1_7_,bVar7);
    if (0 < local_168.c * (int)local_168.cstep) {
      memset(local_168.data,0,(ulong)(uint)(local_168.c * (int)local_168.cstep) << 2);
    }
    if (0 < (int)_c) {
      pp_Var4 = this->_vptr_LRN_x86;
      fVar1 = *(float *)(&this->field_0xd8 + (long)pp_Var4[-3]);
      iVar23 = *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]);
      pvVar10 = bottom_top_blob->data;
      local_110 = local_168.cstep *
                  CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      local_100 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      uVar20 = 0;
      pvVar16 = local_168.data;
      do {
        iVar11 = *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]) / 2;
        iVar15 = (int)uVar20;
        uVar9 = iVar15 - iVar11;
        if ((int)uVar9 <= iVar11 + iVar15) {
          lVar22 = local_168.cstep *
                   CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) * uVar20;
          do {
            if (uVar9 < _c && 0 < iVar8) {
              lVar21 = 0;
              do {
                *(float *)((long)local_168.data + lVar21 * 4 + lVar22) =
                     *(float *)((long)local_168.data + lVar21 * 4 + lVar22) +
                     *(float *)((long)local_f8.data +
                               lVar21 * 4 +
                               (ulong)uVar9 *
                               local_f8.cstep *
                               CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
                lVar21 = lVar21 + 1;
              } while (iVar8 != (int)lVar21);
            }
            bVar7 = (int)uVar9 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]) / 2 + iVar15;
            uVar9 = uVar9 + 1;
          } while (bVar7);
        }
        if (0 < iVar8) {
          lVar22 = 0;
          do {
            fVar24 = powf(*(float *)((long)pvVar16 + lVar22 * 4) * fVar1 * (1.0 / (float)iVar23) +
                          *(float *)(&this->field_0xe0 + (long)pp_Var4[-3]),
                          -*(float *)(&this->field_0xdc + (long)pp_Var4[-3]));
            *(float *)((long)pvVar10 + lVar22 * 4) = fVar24 * *(float *)((long)pvVar10 + lVar22 * 4)
            ;
            lVar22 = lVar22 + 1;
          } while (iVar8 != (int)lVar22);
        }
        uVar20 = uVar20 + 1;
        pvVar16 = (void *)((long)pvVar16 + local_110);
        pvVar10 = (void *)((long)pvVar10 + local_100);
      } while (uVar20 != uVar12);
    }
    piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    iVar23 = -100;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    if ((char)local_118 != '\0') goto LAB_00348b47;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86[-3]) == 1) {
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    local_168.data = local_f8.data;
    local_168.refcount._0_4_ = local_f8.refcount._0_4_;
    local_168.refcount._4_4_ = local_f8.refcount._4_4_;
    local_168.elemsize._0_4_ = (undefined4)local_f8.elemsize;
    local_168.elemsize._4_4_ = local_f8.elemsize._4_4_;
    local_168.elempack = local_f8.elempack;
    local_168.allocator = local_f8.allocator;
    local_168.dims = local_f8.dims;
    local_168.w = local_f8.w;
    local_168.h = local_f8.h;
    local_168.d = local_f8.d;
    local_168.c = local_f8.c;
    local_168.cstep = local_f8.cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    uVar14 = uVar9;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3])) {
      uVar14 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar8 = ~uVar14 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
      copy_make_border(&local_f8,&local_168,uVar14,iVar8,uVar14,iVar8,0,0.0,(Option *)&_space_ofs);
      uVar14 = local_168.w;
      if (local_168.data == (void *)0x0 || (long)local_168.c * local_168.cstep == 0) {
        piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_168.allocator == (Allocator *)0x0) goto joined_r0x00348ad6;
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00348b25;
      }
    }
    iVar23 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
    uVar17 = iVar23 * iVar23;
    fVar1 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar17,&local_169);
    piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pp_Var4 = this->_vptr_LRN_x86;
    iVar8 = *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]);
    if (0 < iVar8) {
      iVar11 = 0;
      iVar15 = 0;
      iVar18 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
          lVar22 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar18 + lVar22] = iVar15 + (int)lVar22;
            lVar22 = lVar22 + 1;
            iVar19 = (int)lVar22;
          } while (iVar19 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
          iVar18 = iVar18 + iVar19;
          iVar15 = iVar15 + iVar19;
        }
        iVar15 = iVar15 + (uVar14 - iVar8);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
    }
    if (0 < (int)_c) {
      local_80 = (long)(int)uVar9;
      local_98 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_a8 = local_168.data;
      local_b0 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
      ;
      local_90 = (long)local_168.w *
                 CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      local_100 = CONCAT44(local_100._4_4_,1.0 / (float)(int)uVar17);
      local_108 = 0;
      do {
        if (0 < (int)local_118) {
          local_88 = (void *)(local_b0 * local_108 + (long)local_a8);
          pvVar10 = (void *)(local_a0 * local_108 + (long)local_98);
          pp_Var4 = this->_vptr_LRN_x86;
          local_110 = 0;
          do {
            pvVar16 = local_88;
            if (0 < (int)uVar9) {
              lVar22 = local_90 * local_110;
              uVar20 = 0;
              do {
                if (iVar23 == 0) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = 0.0;
                  uVar13 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar16 +
                                                (long)piVar6[uVar13] * 4 + uVar20 * 4 + lVar22);
                    uVar13 = uVar13 + 1;
                  } while (uVar17 + (uVar17 == 0) != uVar13);
                }
                fVar24 = powf(fVar24 * fVar1 * (float)local_100 +
                              *(float *)(&this->field_0xe0 + (long)pp_Var4[-3]),
                              -*(float *)(&this->field_0xdc + (long)pp_Var4[-3]));
                *(float *)((long)pvVar10 + uVar20 * 4) =
                     fVar24 * *(float *)((long)pvVar10 + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar9);
            }
            pvVar10 = (void *)((long)pvVar10 + local_80 * 4);
            local_110 = local_110 + 1;
          } while (local_110 != local_118);
        }
        local_108 = local_108 + 1;
      } while (local_108 != uVar12);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
  }
  iVar23 = 0;
LAB_00348b47:
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}